

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

shared_ptr<aeron::Counter> __thiscall
aeron::ClientConductor::findCounter(ClientConductor *this,int64_t registrationId)

{
  char *pcVar1;
  undefined4 uVar2;
  long *plVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  SourcedException *pSVar5;
  long *plVar6;
  char *pcVar7;
  size_type *psVar8;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar9;
  char *pcVar10;
  long lVar11;
  long *plVar12;
  shared_ptr<aeron::Counter> sVar13;
  allocator local_d1;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)(registrationId + 8));
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  plVar6 = *(long **)(registrationId + 0x78);
  plVar3 = *(long **)(registrationId + 0x80);
  lVar11 = (long)plVar3 - (long)plVar6;
  lVar9 = (lVar11 >> 5) * -0x5555555555555555 >> 2;
  if (0 < lVar9) {
    lVar11 = lVar9 + 1;
    plVar12 = plVar6 + 0x18;
    do {
      if (plVar12[-0x18] == in_RDX) {
        plVar12 = plVar12 + -0x18;
        goto LAB_001403b6;
      }
      if (plVar12[-0xc] == in_RDX) {
        plVar12 = plVar12 + -0xc;
        goto LAB_001403b6;
      }
      if (*plVar12 == in_RDX) goto LAB_001403b6;
      if (plVar12[0xc] == in_RDX) {
        plVar12 = plVar12 + 0xc;
        goto LAB_001403b6;
      }
      lVar11 = lVar11 + -1;
      plVar12 = plVar12 + 0x30;
    } while (1 < lVar11);
    lVar11 = (long)plVar3 - (long)(plVar6 + lVar9 * 0x30);
    plVar6 = plVar6 + lVar9 * 0x30;
  }
  lVar9 = (lVar11 >> 5) * -0x5555555555555555;
  if (lVar9 == 1) {
LAB_00140397:
    plVar12 = plVar6;
    if (*plVar6 != in_RDX) {
      plVar12 = plVar3;
    }
LAB_001403b6:
    if (plVar12 != plVar3) {
      std::__shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2> *)this,plVar12 + 10);
      if (plVar12[8] != 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar12[9];
        plVar12[8] = 0;
        plVar12[9] = 0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      if ((this->_vptr_ClientConductor == (_func_int **)0x0) && ((int)plVar12[3] == 0)) {
        if (*(long *)(registrationId + 0x1e8) == 0) {
          std::__throw_bad_function_call();
        }
        lVar9 = (**(code **)(registrationId + 0x1f0))(registrationId + 0x1d8);
        if (*(long *)(registrationId + 0x210) + plVar12[2] < lVar9) {
          pSVar5 = (SourcedException *)__cxa_allocate_exception(0x48);
          std::__cxx11::to_string(&local_70,*(long *)(registrationId + 0x210));
          std::operator+(&local_b0,"no response from driver in ",&local_70);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_d0._M_dataplus._M_p = (pointer)*plVar6;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_d0._M_dataplus._M_p == psVar8) {
            local_d0.field_2._M_allocated_capacity = *psVar8;
            local_d0.field_2._8_4_ = (undefined4)plVar6[3];
            local_d0.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar8;
          }
          local_d0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,
                     "std::shared_ptr<Counter> aeron::ClientConductor::findCounter(std::int64_t)",""
                    );
          pcVar10 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
          ;
          pcVar7 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
          ;
          do {
            pcVar7 = pcVar7 + 1;
            pcVar1 = pcVar10 + 1;
            pcVar10 = pcVar10 + 1;
          } while (*pcVar7 == *pcVar1);
          std::__cxx11::string::string((string *)&local_50,pcVar10 + (*pcVar1 == '/'),&local_d1);
          util::SourcedException::SourcedException(pSVar5,&local_d0,&local_90,&local_50,0x171);
          *(undefined ***)pSVar5 = &PTR__SourcedException_001634e0;
          __cxa_throw(pSVar5,&util::DriverTimeoutException::typeinfo,
                      util::SourcedException::~SourcedException);
        }
      }
      else if ((this->_vptr_ClientConductor == (_func_int **)0x0) && ((int)plVar12[3] == 2)) {
        pSVar5 = (SourcedException *)__cxa_allocate_exception(0x50);
        uVar2 = *(undefined4 *)((long)plVar12 + 0x1c);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "std::shared_ptr<Counter> aeron::ClientConductor::findCounter(std::int64_t)","");
        pcVar10 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
        ;
        pcVar7 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
        do {
          pcVar7 = pcVar7 + 1;
          pcVar1 = pcVar10 + 1;
          pcVar10 = pcVar10 + 1;
        } while (*pcVar7 == *pcVar1);
        std::__cxx11::string::string
                  ((string *)&local_b0,pcVar10 + (*pcVar1 == '/'),(allocator *)&local_70);
        util::SourcedException::SourcedException
                  (pSVar5,(string *)(plVar12 + 4),&local_d0,&local_b0,0x176);
        *(undefined ***)pSVar5 = &PTR__SourcedException_001637c8;
        *(undefined4 *)(pSVar5 + 1) = uVar2;
        __cxa_throw(pSVar5,&util::RegistrationException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      goto LAB_001404b6;
    }
  }
  else {
    if (lVar9 == 2) {
LAB_0014038e:
      plVar12 = plVar6;
      if (*plVar6 != in_RDX) {
        plVar6 = plVar6 + 0xc;
        goto LAB_00140397;
      }
      goto LAB_001403b6;
    }
    if (lVar9 == 3) {
      plVar12 = plVar6;
      if (*plVar6 != in_RDX) {
        plVar6 = plVar6 + 0xc;
        goto LAB_0014038e;
      }
      goto LAB_001403b6;
    }
  }
  this->_vptr_ClientConductor = (_func_int **)0x0;
  (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align = 0;
LAB_001404b6:
  pthread_mutex_unlock((pthread_mutex_t *)(registrationId + 8));
  sVar13.super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar13.super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Counter>)
         sVar13.super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Counter> ClientConductor::findCounter(std::int64_t registrationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(
        m_counters.begin(),
        m_counters.end(),
        [registrationId](const CounterStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it == m_counters.end())
    {
        return std::shared_ptr<Counter>();
    }

    CounterStateDefn& state = *it;
    std::shared_ptr<Counter> counter = state.m_counter.lock();

    if (state.m_counterCache)
    {
        state.m_counterCache.reset();
    }

    if (!counter && RegistrationStatus::AWAITING_MEDIA_DRIVER == state.m_status)
    {
        if (m_epochClock() > (state.m_timeOfRegistration + m_driverTimeoutMs))
        {
            throw DriverTimeoutException(
                "no response from driver in " + std::to_string(m_driverTimeoutMs) + " ms", SOURCEINFO);
        }
    }
    else if (!counter && RegistrationStatus::ERRORED_MEDIA_DRIVER == state.m_status)
    {
        throw RegistrationException(state.m_errorCode, state.m_errorMessage, SOURCEINFO);
    }

    return counter;
}